

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hierarchy.c
# Opt level: O1

char * path_elem(char *path,char *buff,char *sep)

{
  int iVar1;
  size_t sVar2;
  char cVar3;
  long lVar4;
  char *pcVar5;
  
  cVar3 = *path;
  pcVar5 = buff;
  if (cVar3 != '\0') {
    lVar4 = 0;
    do {
      _ecs_assert(lVar4 < 0x40,2,(char *)0x0,"bptr - buff < ECS_MAX_NAME_LENGTH",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O1/flecs-clone-prefix/src/flecs-clone/src/hierarchy.c"
                  ,0xf1);
      if (0x3f < lVar4) {
        __assert_fail("bptr - buff < (64)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O1/flecs-clone-prefix/src/flecs-clone/src/hierarchy.c"
                      ,0xf1,"const char *path_elem(const char *, char *, const char *)");
      }
      sVar2 = strlen(sep);
      iVar1 = strncmp(path,sep,(long)(int)sVar2);
      if (iVar1 == 0) {
        buff[lVar4] = '\0';
        return path + (long)((int)sVar2 + -1) + 1;
      }
      buff[lVar4] = cVar3;
      cVar3 = path[1];
      path = path + 1;
      lVar4 = lVar4 + 1;
    } while (cVar3 != '\0');
    pcVar5 = buff + lVar4;
  }
  if (pcVar5 == buff) {
    path = (char *)0x0;
  }
  else {
    *pcVar5 = '\0';
  }
  return path;
}

Assistant:

static
const char *path_elem(
    const char *path,
    char *buff,
    const char *sep)
{
    const char *ptr;
    char *bptr, ch;

    for (bptr = buff, ptr = path; (ch = *ptr); ptr ++) {
        ecs_assert(bptr - buff < ECS_MAX_NAME_LENGTH, ECS_INVALID_PARAMETER, 
            NULL);
            
        if (is_sep(&ptr, sep)) {
            *bptr = '\0';
            return ptr + 1;
        } else {
            *bptr = ch;
            bptr ++;
        }
    }

    if (bptr != buff) {
        *bptr = '\0';
        return ptr;
    } else {
        return NULL;
    }
}